

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::skipCast
          (OptimizeInstructions *this,Expression **input,Type requiredType)

{
  bool bVar1;
  long lVar2;
  Expression *pEVar3;
  
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).trapsNeverHappen != true) {
    return;
  }
  pEVar3 = *input;
  do {
    if (pEVar3->_id == RefCastId) {
      lVar2 = 0x10;
      if (requiredType.id != 0) {
        bVar1 = wasm::Type::isSubType((Type)*(uintptr_t *)(*(long *)(pEVar3 + 1) + 8),requiredType);
        goto LAB_00aebcf1;
      }
    }
    else {
      if (pEVar3->_id != RefAsId) {
        return;
      }
      lVar2 = 0x18;
      if (requiredType.id != 0) {
        bVar1 = wasm::Type::isSubType((Type)*(uintptr_t *)(pEVar3[1].type.id + 8),requiredType);
LAB_00aebcf1:
        if (bVar1 == false) {
          return;
        }
      }
    }
    pEVar3 = *(Expression **)(&pEVar3->_id + lVar2);
    *input = pEVar3;
  } while( true );
}

Assistant:

void skipCast(Expression*& input, Type requiredType = Type::none) {
    // Traps-never-happen mode is a requirement for us to optimize here.
    if (!getPassOptions().trapsNeverHappen) {
      return;
    }
    while (1) {
      if (auto* as = input->dynCast<RefAs>()) {
        if (requiredType == Type::none ||
            Type::isSubType(as->value->type, requiredType)) {
          input = as->value;
          continue;
        }
      } else if (auto* cast = input->dynCast<RefCast>()) {
        if (requiredType == Type::none ||
            Type::isSubType(cast->ref->type, requiredType)) {
          input = cast->ref;
          continue;
        }
      }
      break;
    }
  }